

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_get_forward_list_Test::TestBody(ObjectTest_basic_get_forward_list_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  AssertHelper local_4c0 [8];
  Message local_4b8 [8];
  _Fwd_list_impl local_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_468 [8];
  Message local_460 [8];
  _Fwd_list_impl local_458;
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_410 [8];
  Message local_408 [8];
  _Fwd_list_impl local_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_3b8 [8];
  Message local_3b0 [8];
  _Fwd_list_impl local_3a8;
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_360 [8];
  Message local_358 [8];
  _Fwd_list_impl local_350;
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_308 [8];
  Message local_300 [8];
  _Fwd_list_impl local_2f8;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2b0 [8];
  Message local_2a8 [8];
  _Fwd_list_impl local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_258 [8];
  Message local_250 [8];
  _Fwd_list_impl local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_200 [8];
  Message local_1f8 [8];
  _Fwd_list_impl local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1a8 [8];
  Message local_1a0 [8];
  _Fwd_list_impl local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150 [8];
  Message local_148 [8];
  _Fwd_list_impl local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8 [8];
  Message local_f0 [8];
  _Fwd_list_impl local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0 [8];
  Message local_98 [24];
  _Fwd_list_impl local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  object obj;
  ObjectTest_basic_get_forward_list_Test *this_local;
  
  jessilib::object::object((object *)&gtest_ar_.message_);
  local_80._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_80);
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_78,(forward_list<bool,_std::allocator<bool>_> *)&gtest_ar_.message_);
  local_78[0xf] =
       std::forward_list<bool,_std::allocator<bool>_>::empty
                 ((forward_list<bool,_std::allocator<bool>_> *)local_78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_68,(bool *)(local_78 + 0xf),(type *)0x0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)local_78);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_68,
               "obj.get<std::forward_list<bool>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=(local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_e8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_e8);
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_e0,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar_.message_);
  local_e0[0xf] =
       std::forward_list<signed_char,_std::allocator<signed_char>_>::empty
                 ((forward_list<signed_char,_std::allocator<signed_char>_> *)local_e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d0,(bool *)(local_e0 + 0xf),(type *)0x0);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)local_e0);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_d0,
               "obj.get<std::forward_list<signed char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_140._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_138,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
  local_138[0xf] =
       std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::empty
                 ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,(bool *)(local_138 + 0xf),(type *)0x0);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_128,
               "obj.get<std::forward_list<unsigned char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_198._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_198);
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_190,(forward_list<short,_std::allocator<short>_> *)&gtest_ar_.message_)
  ;
  local_190[0xf] =
       std::forward_list<short,_std::allocator<short>_>::empty
                 ((forward_list<short,_std::allocator<short>_> *)local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,(bool *)(local_190 + 0xf),(type *)0x0);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)local_190);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_180,
               "obj.get<std::forward_list<short>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1f0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_1f0);
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_1e8,(forward_list<int,_std::allocator<int>_> *)&gtest_ar_.message_);
  local_1e8[0xf] =
       std::forward_list<int,_std::allocator<int>_>::empty
                 ((forward_list<int,_std::allocator<int>_> *)local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,(bool *)(local_1e8 + 0xf),(type *)0x0);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)local_1e8);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_1d8,
               "obj.get<std::forward_list<int>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_248._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_248);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_240,(forward_list<long,_std::allocator<long>_> *)&gtest_ar_.message_);
  local_240[0xf] =
       std::forward_list<long,_std::allocator<long>_>::empty
                 ((forward_list<long,_std::allocator<long>_> *)local_240);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,(bool *)(local_240 + 0xf),(type *)0x0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_240);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_230,
               "obj.get<std::forward_list<long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=(local_258,local_250);
    testing::internal::AssertHelper::~AssertHelper(local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_2a0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_2a0);
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_298,
             (forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar_.message_);
  local_298[0xf] =
       std::forward_list<long_long,_std::allocator<long_long>_>::empty
                 ((forward_list<long_long,_std::allocator<long_long>_> *)local_298);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,(bool *)(local_298 + 0xf),(type *)0x0);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)local_298);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_288,
               "obj.get<std::forward_list<long long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=(local_2b0,local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2f8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_2f8);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_2f0,(forward_list<long,_std::allocator<long>_> *)&gtest_ar_.message_);
  local_2f0[0xf] =
       std::forward_list<long,_std::allocator<long>_>::empty
                 ((forward_list<long,_std::allocator<long>_> *)local_2f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e0,(bool *)(local_2f0 + 0xf),(type *)0x0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_2f0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_2e0,
               "obj.get<std::forward_list<intmax_t>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=(local_308,local_300);
    testing::internal::AssertHelper::~AssertHelper(local_308);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_350._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_350);
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_348,(forward_list<float,_std::allocator<float>_> *)&gtest_ar_.message_)
  ;
  local_348[0xf] =
       std::forward_list<float,_std::allocator<float>_>::empty
                 ((forward_list<float,_std::allocator<float>_> *)local_348);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_338,(bool *)(local_348 + 0xf),(type *)0x0);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)local_348);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_338,
               "obj.get<std::forward_list<float>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_3a8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_3a8);
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_3a0,
             (forward_list<double,_std::allocator<double>_> *)&gtest_ar_.message_);
  local_3a0[0xf] =
       std::forward_list<double,_std::allocator<double>_>::empty
                 ((forward_list<double,_std::allocator<double>_> *)local_3a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,(bool *)(local_3a0 + 0xf),(type *)0x0);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)local_3a0);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_390,
               "obj.get<std::forward_list<double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b8,local_3b0);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_400._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_400);
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_3f8,
             (forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar_.message_);
  local_3f8[0xf] =
       std::forward_list<long_double,_std::allocator<long_double>_>::empty
                 ((forward_list<long_double,_std::allocator<long_double>_> *)local_3f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,(bool *)(local_3f8 + 0xf),(type *)0x0);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)local_3f8);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_3e8,
               "obj.get<std::forward_list<long double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=(local_410,local_408);
    testing::internal::AssertHelper::~AssertHelper(local_410);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_458._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&local_458);
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_450,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar_.message_);
  local_450[0xf] =
       std::
       forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
       ::empty((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                *)local_450);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,(bool *)(local_450 + 0xf),(type *)0x0);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)local_450);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_440,
               "obj.get<std::forward_list<std::u8string>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_4b0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_4b0);
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_4a8,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar_.message_);
  local_4a8[0xf] =
       std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::empty
                 ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_4a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_498,(bool *)(local_4a8 + 0xf),(type *)0x0);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_4a8);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_4e0,local_498,
               "obj.get<std::forward_list<object>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_4e0);
    testing::internal::AssertHelper::AssertHelper
              (local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(local_4c0,local_4b8);
    testing::internal::AssertHelper::~AssertHelper(local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    testing::Message::~Message(local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  jessilib::object::~object((object *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_forward_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::forward_list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<short>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<int>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<float>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<object>>().empty());
}